

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
StrictMockProblemBuilder::StrictMockProblemBuilder(StrictMockProblemBuilder *this,TestSolver *s)

{
  MockSpec<StrictMockProblemBuilder_&()> *this_00;
  TypedExpectation<StrictMockProblemBuilder_&()> *this_01;
  linked_ptr<testing::ActionInterface<StrictMockProblemBuilder_&()>_> local_30;
  StrictMockProblemBuilder *local_20;
  
  testing::StrictMock<MockProblemBuilder>::StrictMock(&this->super_StrictMock<MockProblemBuilder>);
  (this->super_StrictMock<MockProblemBuilder>)._vptr_StrictMock =
       (_func_int **)&PTR__StrictMockProblemBuilder_0025d2b8;
  testing::internal::FunctionMocker<StrictMockProblemBuilder_&()>::FunctionMocker
            (&this->gmock0_problem_111);
  s->builder = this;
  if (s->call_problem_ == true) {
    this_00 = gmock_problem(this);
    this_01 = testing::internal::MockSpec<StrictMockProblemBuilder_&()>::InternalExpectedAt
                        (this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc"
                         ,0x6c,"*this","problem()");
    local_20 = this;
    testing::internal::ReturnRefAction::operator_cast_to_Action((ReturnRefAction *)&local_30);
    testing::internal::TypedExpectation<StrictMockProblemBuilder_&()>::WillOnce
              (this_01,(Action<StrictMockProblemBuilder_&()> *)&local_30);
    testing::internal::linked_ptr<testing::ActionInterface<StrictMockProblemBuilder_&()>_>::
    ~linked_ptr(&local_30);
  }
  return;
}

Assistant:

explicit StrictMockProblemBuilder(TestSolver &s) {
    s.builder = this;
    if (s.call_problem())
      EXPECT_CALL(*this, problem()).WillOnce(testing::ReturnRef(*this));
  }